

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseSuffixes(StructuralParser *this,Expression *expression)

{
  SourceCodeText *o;
  char *__s1;
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CommaSeparatedList *pCVar5;
  long lVar6;
  QualifiedIdentifier *nameOrTargetType;
  PoolItem *pPVar7;
  CommaSeparatedList *pCVar8;
  IdentifierPath local_88;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if ((__s1 == ".") || ((__s1 != (char *)0x0 && (iVar4 = strcmp(__s1,"."), iVar4 == 0)))) {
    pCVar8 = (CommaSeparatedList *)parseDotOperator(this,expression);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
    if (bVar2) {
      pCVar5 = parseCommaSeparatedListOfExpressions(this,false,false);
      lVar6 = __dynamic_cast(expression,&AST::Expression::typeinfo,&AST::DotOperator::typeinfo);
      pCVar8 = pCVar5;
      if (lVar6 != 0) {
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
                  (&pCVar5->items,(pCVar5->items).items,
                   (pool_ref<soul::AST::Expression> *)(lVar6 + 0x30));
        lVar1 = *(long *)(lVar6 + 0x38);
        IdentifierPath::IdentifierPath(&local_88,*(string **)(*(long *)(lVar6 + 0x38) + 0x30));
        nameOrTargetType =
             PoolAllocator::
             allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                       (&this->allocator->pool,(Context *)(lVar1 + 0x10),&local_88);
        local_88.pathSections.numActive = 0;
        if (8 < local_88.pathSections.numAllocated) {
          if ((CommaSeparatedList *)local_88.pathSections.items != (CommaSeparatedList *)0x0) {
            operator_delete__(local_88.pathSections.items);
          }
          local_88.pathSections.items = (Identifier *)local_88.pathSections.space;
          local_88.pathSections.numAllocated = 8;
        }
        pPVar7 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x48);
        local_88.pathSections.items = (Identifier *)pCVar5;
        AST::CallOrCast::CallOrCast
                  ((CallOrCast *)&pPVar7->item,&nameOrTargetType->super_Expression,
                   (pool_ptr<soul::AST::CommaSeparatedList> *)&local_88,true);
        pPVar7->destructor =
             PoolAllocator::
             allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::AST::CommaSeparatedList_&,_bool>
             ::anon_class_1_0_00000001::__invoke;
        pCVar8 = (CommaSeparatedList *)parseSuffixes(this,(Expression *)&pPVar7->item);
      }
      if (lVar6 == 0) {
        pPVar7 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x48);
        local_88.pathSections.items = (Identifier *)pCVar5;
        AST::CallOrCast::CallOrCast
                  ((CallOrCast *)&pPVar7->item,expression,
                   (pool_ptr<soul::AST::CommaSeparatedList> *)&local_88,false);
        pPVar7->destructor =
             PoolAllocator::
             allocate<soul::AST::CallOrCast,_soul::AST::Expression_&,_soul::AST::CommaSeparatedList_&,_bool>
             ::anon_class_1_0_00000001::__invoke;
        pCVar8 = (CommaSeparatedList *)parseSuffixes(this,(Expression *)&pPVar7->item);
      }
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288e63);
      if (bVar2) {
        pCVar8 = (CommaSeparatedList *)parseSubscriptWithBrackets(this,expression);
      }
      else {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261dd5);
        if ((bVar2) ||
           (bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x28452b),
           pCVar8 = (CommaSeparatedList *)expression, bVar3)) {
          pCVar8 = (CommaSeparatedList *)parsePostIncDec(this,expression,bVar2);
        }
      }
    }
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return &pCVar8->super_Expression;
}

Assistant:

AST::Expression& parseSuffixes (AST::Expression& expression)
    {
        auto context = getContext();

        if (matches (Operator::dot))
            return parseDotOperator (expression);

        if (matchIf (Operator::openParen))
        {
            auto& args = parseCommaSeparatedListOfExpressions (false, false);

            if (auto dot = cast<AST::DotOperator> (expression))
            {
                args.items.insert (args.items.begin(), dot->lhs);
                auto& fn = allocate<AST::QualifiedIdentifier> (dot->rhs.context, IdentifierPath (dot->rhs.identifier));
                return parseSuffixes (allocate<AST::CallOrCast> (fn, args, true));
            }

            return parseSuffixes (allocate<AST::CallOrCast> (expression, args, false));
        }

        if (matchIf (Operator::openBracket))  return parseSubscriptWithBrackets (expression);
        if (matchIf (Operator::plusplus))     return parsePostIncDec (expression, true);
        if (matchIf (Operator::minusminus))   return parsePostIncDec (expression, false);

        return expression;
    }